

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprPrinter>::ObjHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *this)

{
  LinearPartHandler linear_expr;
  bool bVar1;
  int iVar2;
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *in_RDI;
  LinearObjHandler LVar3;
  int num_terms;
  int index;
  ObjHandler lh;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ObjHandler local_10 [2];
  
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ObjHandler::ObjHandler
            ((ObjHandler *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ObjHandler::num_items(local_10);
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ReadUInt
            ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
            );
  iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  TextReader<fmt::Locale>::ReadTillEndOfLine
            ((TextReader<fmt::Locale> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  bVar1 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ObjHandler::SkipExpr
                    ((ObjHandler *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
  if (bVar1) {
    NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::
    ReadLinearExpr<mp::internal::NullLinearExprHandler>(in_RDI,iVar2);
  }
  else {
    LVar3 = NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::ObjHandler::OnLinearExpr
                      ((ObjHandler *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    linear_expr.obj_index = in_stack_ffffffffffffffd0;
    linear_expr.num_terms = (int)LVar3._8_8_;
    linear_expr.nonlinear_expr_id = (int)((ulong)LVar3._8_8_ >> 0x20);
    linear_expr._12_4_ = LVar3.num_terms;
    NLReader<mp::internal::TextReader<fmt::Locale>,_ExprPrinter>::
    ReadLinearExpr<ExprPrinter::LinearPartHandler>
              (LVar3._0_8_,(int)((ulong)in_RDI >> 0x20),linear_expr);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}